

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_NtkUpdate(Sfm_Ntk_t *p,int iNode,int f,int iFaninNew,word uTruth)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint iFanin;
  long lVar12;
  bool bVar13;
  
  if ((-1 < iNode) && (iNode < (p->vFanins).nSize)) {
    if (-1 < f) {
      pVVar4 = (p->vFanins).pArray;
      if (f < pVVar4[(uint)iNode].nSize) {
        if ((iNode < p->nPis) || (p->nObjs <= p->nPos + iNode)) {
          __assert_fail("Sfm_ObjIsNode(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                        ,0x141,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
        }
        iFanin = pVVar4[(uint)iNode].pArray[(uint)f];
        if (iFanin == iFaninNew) {
          __assert_fail("iFanin != iFaninNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                        ,0x142,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
        }
        if (6 < pVVar4[(uint)iNode].nSize) {
          __assert_fail("Sfm_ObjFaninNum(p, iNode) <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                        ,0x143,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
        }
        if (uTruth + 1 < 2) {
          if ((p->vFanins).nSize <= iNode) goto LAB_0052b2ff;
          pVVar4 = (p->vFanins).pArray;
          if (0 < pVVar4[(uint)iNode].nSize) {
            lVar7 = 0;
            do {
              if (pVVar4[(uint)iNode].nSize <= lVar7) goto LAB_0052b33d;
              iFanin = pVVar4[(uint)iNode].pArray[lVar7];
              lVar12 = (long)(int)iFanin;
              if ((lVar12 < 0) || ((p->vFanouts).nSize <= (int)iFanin)) goto LAB_0052b2ff;
              pVVar4 = (p->vFanouts).pArray;
              uVar1 = pVVar4[lVar12].nSize;
              uVar6 = 0;
              bVar13 = 0 < (int)uVar1;
              if (0 < (int)uVar1) {
                bVar13 = true;
                if (*pVVar4[lVar12].pArray != iNode) {
                  uVar10 = 0;
                  do {
                    if ((ulong)uVar1 - 1 == uVar10) {
                      bVar13 = false;
                      uVar6 = (ulong)uVar1;
                      goto LAB_0052b1a9;
                    }
                    uVar6 = uVar10 + 1;
                    lVar3 = uVar10 + 1;
                    uVar10 = uVar6;
                  } while (pVVar4[lVar12].pArray[lVar3] != iNode);
                  bVar13 = uVar6 < uVar1;
                }
              }
LAB_0052b1a9:
              uVar5 = (uint)uVar6;
              if (uVar5 == uVar1) {
LAB_0052b31e:
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmNtk.c"
                              ,0x148,"void Sfm_NtkUpdate(Sfm_Ntk_t *, int, int, int, word)");
              }
              if (!bVar13) {
                __assert_fail("i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
              }
              uVar9 = uVar1;
              if ((int)(uVar5 + 1) < (int)uVar1) {
                piVar2 = pVVar4[lVar12].pArray;
                piVar8 = piVar2 + (uVar5 + 1);
                uVar6 = uVar6 & 0xffffffff;
                do {
                  iVar11 = (int)uVar6;
                  piVar2[uVar6] = *piVar8;
                  uVar9 = pVVar4[lVar12].nSize;
                  piVar8 = piVar8 + 1;
                  uVar6 = (ulong)(iVar11 + 1);
                } while (iVar11 + 2 < (int)uVar9);
              }
              pVVar4[lVar12].nSize = uVar9 - 1;
              if (uVar5 == uVar1) goto LAB_0052b31e;
              Sfm_NtkDeleteObj_rec(p,iFanin);
              if ((p->vFanins).nSize <= iNode) goto LAB_0052b2ff;
              lVar7 = lVar7 + 1;
              pVVar4 = (p->vFanins).pArray;
            } while (lVar7 < pVVar4[(uint)iNode].nSize);
          }
          pVVar4[(uint)iNode].nSize = 0;
        }
        else {
          Sfm_NtkRemoveFanin(p,iNode,iFanin);
          Sfm_NtkAddFanin(p,iNode,iFaninNew);
          Sfm_NtkDeleteObj_rec(p,iFanin);
        }
        Sfm_NtkUpdateLevel_rec(p,iNode);
        if (iFaninNew != -1) {
          Sfm_NtkUpdateLevelR_rec(p,iFaninNew);
        }
        if ((-1 < (int)iFanin) && ((int)iFanin < (p->vFanouts).nSize)) {
          if (0 < (p->vFanouts).pArray[iFanin].nSize) {
            Sfm_NtkUpdateLevelR_rec(p,iFanin);
          }
          if (p->vTruths->nSize <= iNode) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          p->vTruths->pArray[(uint)iNode] = uTruth;
          if ((iNode < (p->vFanins).nSize) && (iNode < p->vCnfs->nSize)) {
            Sfm_TruthToCnf(uTruth,(word *)0x0,(p->vFanins).pArray[(uint)iNode].nSize,p->vCover,
                           (Vec_Str_t *)(p->vCnfs->pArray + (uint)iNode));
            return;
          }
        }
        goto LAB_0052b2ff;
      }
    }
LAB_0052b33d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_0052b2ff:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Sfm_NtkUpdate( Sfm_Ntk_t * p, int iNode, int f, int iFaninNew, word uTruth )
{
    int iFanin = Sfm_ObjFanin( p, iNode, f );
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( iFanin != iFaninNew );
    assert( Sfm_ObjFaninNum(p, iNode) <= 6 );
    if ( uTruth == 0 || ~uTruth == 0 )
    {
        Sfm_ObjForEachFanin( p, iNode, iFanin, f )
        {
            int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
            Sfm_NtkDeleteObj_rec( p, iFanin );
        }
        Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    }
    else
    {
        // replace old fanin by new fanin
        Sfm_NtkRemoveFanin( p, iNode, iFanin );
        Sfm_NtkAddFanin( p, iNode, iFaninNew );
        // recursively remove MFFC
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    // update logic level
    Sfm_NtkUpdateLevel_rec( p, iNode );
    if ( iFaninNew != -1 )
        Sfm_NtkUpdateLevelR_rec( p, iFaninNew );
    if ( Sfm_ObjFanoutNum(p, iFanin) > 0 )
        Sfm_NtkUpdateLevelR_rec( p, iFanin );
    // update truth table
    Vec_WrdWriteEntry( p->vTruths, iNode, uTruth );
    Sfm_TruthToCnf( uTruth, NULL, Sfm_ObjFaninNum(p, iNode), p->vCover, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode) );
}